

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall OpenMD::Integrator::finalize(Integrator *this)

{
  pointer this_00;
  long in_RDI;
  DumpWriter *unaff_retaddr;
  StatWriter *in_stack_00000060;
  RNEMD *in_stack_000002f0;
  
  DumpWriter::writeEor(unaff_retaddr);
  if ((*(byte *)(in_RDI + 0xb4) & 1) != 0) {
    std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::operator->
              ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
               0x264b6e);
    RNEMD::RNEMD::writeOutputFile(in_stack_000002f0);
  }
  this_00 = std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::
            operator->((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *
                       )0x264b87);
  ProgressBar::setStatus(this_00,*(RealType *)(in_RDI + 0x18),*(RealType *)(in_RDI + 0x18));
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::operator->
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)0x264baf)
  ;
  ProgressBar::update((ProgressBar *)in_stack_00000060);
  StatWriter::writeStatReport(in_stack_00000060);
  return;
}

Assistant:

void Integrator::finalize() {
    dumpWriter->writeEor();
    if (useRNEMD) { rnemd_->writeOutputFile(); }
    progressBar->setStatus(runTime, runTime);
    progressBar->update();

    statWriter->writeStatReport();
  }